

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

BasicHandleInfo * __thiscall
helics::HandleManager::getInterfaceHandle
          (HandleManager *this,InterfaceHandle handle,InterfaceType type)

{
  InterfaceType IVar1;
  _Map_pointer ppBVar2;
  reference pBVar3;
  
  if (handle.hid < 0) {
    return (BasicHandleInfo *)0x0;
  }
  ppBVar2 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if ((int)((int)((ulong)((long)(this->handles).
                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * 0x286bca1b +
           (int)((ulong)((long)(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->handles).
                              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * 0x286bca1b
           + ((int)((ulong)((long)ppBVar2 -
                           (long)(this->handles).
                                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppBVar2 == (_Map_pointer)0x0)) * 3) <= handle.hid) {
    return (BasicHandleInfo *)0x0;
  }
  pBVar3 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](&(this->handles).
                         super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                         ._M_impl.super__Deque_impl_data._M_start,(ulong)(uint)handle.hid);
  IVar1 = pBVar3->handleType;
  if (IVar1 == type) {
    return pBVar3;
  }
  if (type != ENDPOINT) {
    if (type == PUBLICATION) {
      if (IVar1 != TRANSLATOR) {
        return (BasicHandleInfo *)0x0;
      }
      return pBVar3;
    }
    if (type != INPUT) {
      return (BasicHandleInfo *)0x0;
    }
  }
  if (1 < (byte)(IVar1 + 0x8d)) {
    return (BasicHandleInfo *)0x0;
  }
  return pBVar3;
}

Assistant:

int32_t HandleManager::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    auto index = handle.baseValue();
    bool rvalue{false};
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_ONLY_UPDATE_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_update_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_ONLY_TRANSMIT_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_transmit_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                rvalue = checkActionFlag(handles[index], required_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                rvalue = checkActionFlag(handles[index], optional_flag);
                break;
            case HELICS_HANDLE_OPTION_SINGLE_CONNECTION_ONLY:
                rvalue = checkActionFlag(handles[index], single_connection_flag);
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                rvalue = checkActionFlag(handles[index], reconnectable_flag);
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                rvalue = checkActionFlag(handles[index], receive_only_flag);
                break;
            default:
                break;
        }
    }
    return rvalue ? 1 : 0;
}